

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAttribute.cpp
# Opt level: O3

void __thiscall
iDynTree::XMLAttribute::XMLAttribute
          (XMLAttribute *this,string *name,string *value,string *prefix,string *uri)

{
  pointer pcVar1;
  
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  (this->m_value)._M_dataplus._M_p = (pointer)&(this->m_value).field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_value,pcVar1,pcVar1 + value->_M_string_length);
  (this->m_prefix)._M_dataplus._M_p = (pointer)&(this->m_prefix).field_2;
  pcVar1 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_prefix,pcVar1,pcVar1 + prefix->_M_string_length);
  (this->m_uri)._M_dataplus._M_p = (pointer)&(this->m_uri).field_2;
  pcVar1 = (uri->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_uri,pcVar1,pcVar1 + uri->_M_string_length);
  return;
}

Assistant:

XMLAttribute::XMLAttribute(std::string name, std::string value, std::string prefix, std::string uri)
    : m_name(name)
    , m_value(value)
    , m_prefix(prefix)
    , m_uri(uri) {}